

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdUnblindTxOutData(void *handle,char *blinding_key,char *locking_script,char *asset_commitment,
                       char *value_commitment,char *commitment_nonce,char *rangeproof,char **asset,
                       int64_t *amount,char **asset_blind_factor,char **value_blind_factor)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  int64_t iVar4;
  Amount AVar5;
  char *work_value_blinder;
  char *work_asset_blinder;
  char *work_asset;
  UnblindParameter unblind_data;
  Privkey blinding_key_obj;
  ConfidentialNonce nonce;
  ConfidentialValue value;
  ConfidentialAssetId asset_obj;
  ConfidentialTxOut txout;
  ByteData rangeproof_obj;
  Script locking_script_obj;
  allocator local_2e9;
  char *local_2e8;
  void *local_2e0;
  undefined1 local_2d8 [16];
  char local_2c8 [16];
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  UnblindParameter local_2a0;
  Privkey local_210;
  ConfidentialNonce local_1f0;
  ConfidentialValue local_1c8;
  ConfidentialAssetId local_1a0;
  undefined1 local_178 [248];
  ByteData local_80;
  Script local_68;
  
  local_2a8 = (char *)0x0;
  local_2b0 = (char *)0x0;
  local_2b8 = (char *)0x0;
  local_2e8 = commitment_nonce;
  local_2e0 = handle;
  cfd::Initialize();
  local_178._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_178._8_4_ = 0xc28;
  local_178._16_8_ = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString(locking_script,"locking_script",(CfdSourceLocation *)local_178);
  local_178._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_178._8_4_ = 0xc29;
  local_178._16_8_ = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString(asset_commitment,"asset",(CfdSourceLocation *)local_178);
  local_178._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_178._8_4_ = 0xc2a;
  local_178._16_8_ = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString(value_commitment,"value_commitment",(CfdSourceLocation *)local_178);
  local_178._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_178._8_4_ = 0xc2b;
  local_178._16_8_ = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString(local_2e8,"commitment_nonce",(CfdSourceLocation *)local_178);
  local_178._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_178._8_4_ = 0xc2c;
  local_178._16_8_ = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString(rangeproof,"rangeproof",(CfdSourceLocation *)local_178);
  local_178._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_178._8_4_ = 0xc2d;
  local_178._16_8_ = "CfdUnblindTxOutData";
  cfd::capi::CheckEmptyString(blinding_key,"blinding_key",(CfdSourceLocation *)local_178);
  std::__cxx11::string::string((string *)local_178,locking_script,(allocator *)&local_2a0);
  cfd::core::Script::Script(&local_68,(string *)local_178);
  pcVar2 = local_178 + 0x10;
  if ((char *)local_178._0_8_ != pcVar2) {
    operator_delete((void *)local_178._0_8_);
  }
  std::__cxx11::string::string((string *)local_178,asset_commitment,(allocator *)&local_2a0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1a0,(string *)local_178);
  if ((char *)local_178._0_8_ != pcVar2) {
    operator_delete((void *)local_178._0_8_);
  }
  std::__cxx11::string::string((string *)local_178,value_commitment,(allocator *)&local_2a0);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_1c8,(string *)local_178);
  if ((char *)local_178._0_8_ != pcVar2) {
    operator_delete((void *)local_178._0_8_);
  }
  std::__cxx11::string::string((string *)local_178,local_2e8,(allocator *)&local_2a0);
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_1f0,(string *)local_178);
  if ((char *)local_178._0_8_ != pcVar2) {
    operator_delete((void *)local_178._0_8_);
  }
  std::__cxx11::string::string((string *)local_178,rangeproof,(allocator *)&local_2a0);
  cfd::core::ByteData::ByteData(&local_80,(string *)local_178);
  if ((char *)local_178._0_8_ != pcVar2) {
    operator_delete((void *)local_178._0_8_);
  }
  std::__cxx11::string::string((string *)local_178,blinding_key,(allocator *)local_2d8);
  bVar1 = cfd::core::Privkey::HasWif((string *)local_178,(NetType *)0x0,(bool *)0x0);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_2a0,blinding_key,&local_2e9);
    cfd::core::Privkey::FromWif(&local_210,(string *)&local_2a0,kCustomChain,true);
  }
  else {
    std::__cxx11::string::string((string *)&local_2a0,blinding_key,&local_2e9);
    cfd::core::Privkey::Privkey(&local_210,(string *)&local_2a0,kMainnet,true);
  }
  if (local_2a0.asset._vptr_ConfidentialAssetId !=
      (_func_int **)
      ((long)&local_2a0.asset.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8U)) {
    operator_delete(local_2a0.asset._vptr_ConfidentialAssetId);
  }
  if ((char *)local_178._0_8_ != pcVar2) {
    operator_delete((void *)local_178._0_8_);
  }
  cfd::core::ByteData::ByteData((ByteData *)&local_2a0);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            ((ConfidentialTxOut *)local_178,&local_68,&local_1a0,&local_1c8,&local_1f0,
             (ByteData *)&local_2a0,&local_80);
  if (local_2a0.asset._vptr_ConfidentialAssetId != (_func_int **)0x0) {
    operator_delete(local_2a0.asset._vptr_ConfidentialAssetId);
  }
  cfd::core::ConfidentialTxOut::Unblind(&local_2a0,(ConfidentialTxOut *)local_178,&local_210);
  if (asset == (char **)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2d8,&local_2a0.asset);
    pcVar2 = cfd::capi::CreateString((string *)local_2d8);
    local_2a8 = pcVar2;
    if ((char *)local_2d8._0_8_ != local_2c8) {
      operator_delete((void *)local_2d8._0_8_);
    }
  }
  if (asset_blind_factor == (char **)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_2d8,&local_2a0.abf);
    pcVar3 = cfd::capi::CreateString((string *)local_2d8);
    local_2b0 = pcVar3;
    if ((char *)local_2d8._0_8_ != local_2c8) {
      operator_delete((void *)local_2d8._0_8_);
    }
  }
  local_2e8 = pcVar3;
  if (value_blind_factor == (char **)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)local_2d8,&local_2a0.vbf);
    pcVar3 = cfd::capi::CreateString((string *)local_2d8);
    local_2b8 = pcVar3;
    if ((char *)local_2d8._0_8_ != local_2c8) {
      operator_delete((void *)local_2d8._0_8_);
    }
  }
  if (amount != (int64_t *)0x0) {
    AVar5 = cfd::core::ConfidentialValue::GetAmount(&local_2a0.value);
    local_2d8._0_8_ = AVar5.amount_;
    local_2d8[8] = AVar5.ignore_check_;
    iVar4 = cfd::core::Amount::GetSatoshiValue((Amount *)local_2d8);
    *amount = iVar4;
  }
  if (asset != (char **)0x0) {
    *asset = pcVar2;
  }
  if (asset_blind_factor != (char **)0x0) {
    *asset_blind_factor = local_2e8;
  }
  if (value_blind_factor != (char **)0x0) {
    *value_blind_factor = pcVar3;
  }
  local_2a0.value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
  if (local_2a0.value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.value.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2a0.vbf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_00723500;
  if (local_2a0.vbf.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.vbf.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2a0.abf._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_00723500;
  if (local_2a0.abf.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.abf.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2a0.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
  if (local_2a0.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.asset.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_178);
  if (local_210.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1f0._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_00723710;
  if (local_1f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1c8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
  if (local_1c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1a0._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
  if (local_1a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::Script::~Script(&local_68);
  return 0;
}

Assistant:

int CfdUnblindTxOutData(
    void* handle, const char* blinding_key, const char* locking_script,
    const char* asset_commitment, const char* value_commitment,
    const char* commitment_nonce, const char* rangeproof, char** asset,
    int64_t* amount, char** asset_blind_factor, char** value_blind_factor) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_asset = nullptr;
  char* work_asset_blinder = nullptr;
  char* work_value_blinder = nullptr;
  try {
    cfd::Initialize();
    CheckEmptyString(locking_script, "locking_script", CFD_LOG_SOURCE);
    CheckEmptyString(asset_commitment, "asset", CFD_LOG_SOURCE);
    CheckEmptyString(value_commitment, "value_commitment", CFD_LOG_SOURCE);
    CheckEmptyString(commitment_nonce, "commitment_nonce", CFD_LOG_SOURCE);
    CheckEmptyString(rangeproof, "rangeproof", CFD_LOG_SOURCE);
    CheckEmptyString(blinding_key, "blinding_key", CFD_LOG_SOURCE);

    Script locking_script_obj(locking_script);
    ConfidentialAssetId asset_obj(asset_commitment);
    ConfidentialValue value(value_commitment);
    ConfidentialNonce nonce(commitment_nonce);
    ByteData rangeproof_obj(rangeproof);
    Privkey blinding_key_obj = Privkey::HasWif(blinding_key)
                                   ? Privkey::FromWif(blinding_key)
                                   : Privkey(blinding_key);
    ConfidentialTxOut txout(
        locking_script_obj, asset_obj, value, nonce, ByteData(),
        rangeproof_obj);
    auto unblind_data = txout.Unblind(blinding_key_obj);

    if (asset != nullptr) {
      work_asset = CreateString(unblind_data.asset.GetHex());
    }
    if (asset_blind_factor != nullptr) {
      work_asset_blinder = CreateString(unblind_data.abf.GetHex());
    }
    if (value_blind_factor != nullptr) {
      work_value_blinder = CreateString(unblind_data.vbf.GetHex());
    }
    if (amount != nullptr) {
      *amount = unblind_data.value.GetAmount().GetSatoshiValue();
    }

    if (asset != nullptr) *asset = work_asset;
    if (asset_blind_factor != nullptr) {
      *asset_blind_factor = work_asset_blinder;
    }
    if (value_blind_factor != nullptr) {
      *value_blind_factor = work_value_blinder;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_asset, &work_asset_blinder, &work_value_blinder);
  return result;
}